

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O3

void __thiscall
CTestGen9Resource_Test2DTileYfResource_Test::TestBody
          (CTestGen9Resource_Test2DTileYfResource_Test *this)

{
  uint uVar1;
  GMM_RESOURCE_INFO *pGVar2;
  uint32_t *puVar3;
  long lVar4;
  uint *puVar5;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  ulong uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_38 = 0;
  local_b0 = 2;
  local_48 = 0x100000000;
  local_a0 = 0x3000000000;
  local_a8 = 0x400000000;
  puVar3 = &DAT_001a7480;
  lVar4 = 0;
  do {
    local_ac = *(undefined4 *)((long)&DAT_001a7f2c + lVar4);
    uStack_80 = 1;
    local_78 = CONCAT44(local_78._4_4_,1);
    pGVar2 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_b0);
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)this,pGVar2,*(uint32_t *)((long)&DAT_001a7440 + lVar4));
    CTestResource::VerifyResourceVAlign<true>
              ((CTestResource *)this,pGVar2,*(uint32_t *)((long)&DAT_001a7460 + lVar4));
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar2,*puVar3);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar2,1);
    CTestResource::VerifyResourceSize<true>((CTestResource *)this,pGVar2,0x1000);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar2);
    lVar4 = lVar4 + 4;
    puVar3 = puVar3 + 2;
  } while (lVar4 != 0x14);
  puVar5 = &DAT_001a7480;
  lVar4 = 0;
  do {
    local_ac = *(undefined4 *)((long)&DAT_001a7f2c + lVar4);
    uVar1 = *puVar5;
    uStack_80 = (ulong)(uVar1 / *(uint *)((long)&DAT_001a7f18 + lVar4) + 1);
    local_78 = 0x100000001;
    pGVar2 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_b0,
                        (ulong)uVar1 % (ulong)*(uint *)((long)&DAT_001a7f18 + lVar4));
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)this,pGVar2,*(uint32_t *)((long)&DAT_001a7440 + lVar4));
    CTestResource::VerifyResourceVAlign<true>
              ((CTestResource *)this,pGVar2,*(uint32_t *)((long)&DAT_001a7460 + lVar4));
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar2,uVar1 * 2);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar2,2);
    CTestResource::VerifyResourceSize<true>((CTestResource *)this,pGVar2,0x2000);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar2);
    lVar4 = lVar4 + 4;
    puVar5 = puVar5 + 2;
  } while (lVar4 != 0x14);
  lVar4 = 0;
  do {
    local_ac = *(undefined4 *)((long)&DAT_001a7f2c + lVar4);
    uVar1 = *(uint *)((long)&DAT_001a7480 + lVar4 * 2);
    uStack_80 = (ulong)(uVar1 / *(uint *)((long)&DAT_001a7f18 + lVar4) + 1);
    local_78 = CONCAT44(1,*(int *)((long)&DAT_001a7484 + lVar4 * 2) + 1);
    pGVar2 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_b0,
                        (ulong)uVar1 % (ulong)*(uint *)((long)&DAT_001a7f18 + lVar4));
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)this,pGVar2,*(uint32_t *)((long)&DAT_001a7440 + lVar4));
    CTestResource::VerifyResourceVAlign<true>
              ((CTestResource *)this,pGVar2,*(uint32_t *)((long)&DAT_001a7460 + lVar4));
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar2,uVar1 * 2);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar2,2);
    CTestResource::VerifyResourceSize<true>((CTestResource *)this,pGVar2,0x4000);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar2);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x14);
  return;
}

Assistant:

TEST_F(CTestGen9Resource, Test2DTileYfResource)
{
    const uint32_t HAlign[TEST_BPP_MAX] = {64, 64, 32, 32, 16};
    const uint32_t VAlign[TEST_BPP_MAX] = {64, 32, 32, 16, 16};

    const uint32_t TileSize[TEST_BPP_MAX][2] = {{64, 64},
                                                {128, 32},
                                                {128, 32},
                                                {256, 16},
                                                {256, 16}};

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_2D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.TiledY    = 1;
    gmmParams.Flags.Info.TiledYf   = 1;
    gmmParams.Flags.Gpu.Texture    = 1;

    //Allocate 1x1 surface
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x1;
        gmmParams.BaseHeight  = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[i][0]); // As wide as 1 Tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 1);       // 1 Tile wide
        VerifyResourceSize<true>(ResourceInfo, GMM_KBYTE(4));    // 1 Tile Big
        VerifyResourceQPitch<false>(ResourceInfo, 0);            // Not Tested

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate surface that requires multi tiles in two dimension
    // Allocate 2 tiles in X dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1; // 1 pixel larger than 1 tile width
        gmmParams.BaseHeight  = 0x1;
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[i][0] * 2); // As wide as 2 tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2);           // 2 tile wide
        VerifyResourceSize<true>(ResourceInfo, GMM_KBYTE(4) * 2);    // 2 tile big

        VerifyResourceQPitch<false>(ResourceInfo, 0); // Not tested

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 2 tiles in X/Y dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1; // 1 pixel larger than 1 tile width
        gmmParams.BaseHeight  = TileSize[i][1] + 1;                      // 1 row larger than 1 tile height
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[i][0] * 2); // As wide as 2 tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2);           // 2 tile wide
        VerifyResourceSize<true>(ResourceInfo, GMM_KBYTE(4) * 4);    // 4 tile big

        VerifyResourceQPitch<false>(ResourceInfo, 0); // Not tested

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}